

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeTetra>::ConnectOrder
          (TPZCompElHCurl<pzshape::TPZShapeTetra> *this,int connect)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  string local_1c0 [32];
  stringstream sout;
  ostream local_190 [376];
  
  if (-1 < connect) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (connect < iVar1) {
      lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,connect);
      return (int)*(byte *)(lVar2 + 0x14);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sout);
  poVar3 = std::operator<<(local_190,
                           "virtual int TPZCompElHCurl<pzshape::TPZShapeTetra>::ConnectOrder(int) const [TSHAPE = pzshape::TPZShapeTetra]"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(local_190,"Connect index out of range connect ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,connect);
  poVar3 = std::operator<<(poVar3," nconnects ");
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  std::ostream::operator<<(poVar3,iVar1);
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<((ostream *)&std::cerr,local_1c0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_1c0);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
             ,0x106);
}

Assistant:

int TPZCompElHCurl<TSHAPE>::ConnectOrder(int connect) const {
    if (connect < 0 || connect >= this->NConnects()) {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__<<std::endl;
        sout << "Connect index out of range connect " << connect << " nconnects " << NConnects();
        PZError<<sout.str()<<std::endl;
#ifdef PZ_LOG
        LOGPZ_ERROR(logger, sout.str())
#endif
        DebugStop();
        return -1;
    }
    TPZConnect &c = this-> Connect(connect);
    return c.Order();
}